

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::MergingIterator::SeekToLast(MergingIterator *this)

{
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < this->n_; lVar2 = lVar2 + 1) {
    IteratorWrapper::SeekToLast((IteratorWrapper *)((long)&this->children_->iter_ + lVar1));
    lVar1 = lVar1 + 0x20;
  }
  FindLargest(this);
  this->direction_ = kReverse;
  return;
}

Assistant:

void SeekToLast() override {
    for (int i = 0; i < n_; i++) {
      children_[i].SeekToLast();
    }
    FindLargest();
    direction_ = kReverse;
  }